

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_string(_internal_exr_context *ctxt,_internal_exr_seq_scratch *scratch,
                   exr_attr_string_t *attrdata,char *aname,char *tname,int32_t attrsz,char *strptr)

{
  int iVar1;
  exr_result_t eVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  exr_attr_string_t *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  exr_result_t rv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = (**(code **)(in_RSI + 0x20))(in_RSI,tname,(long)in_R9D);
  if (iVar1 == 0) {
    tname[in_R9D] = '\0';
    eVar2 = exr_attr_string_init_static_with_length
                      ((exr_context_t)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,(int32_t)((ulong)in_RDX >> 0x20));
  }
  else {
    eVar2 = (*(code *)in_RDI[4].str)(in_RDI,iVar1,"Unable to read \'%s\' %s data",in_RCX,in_R8);
  }
  return eVar2;
}

Assistant:

static exr_result_t
extract_attr_string (
    struct _internal_exr_context*     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_string_t*                attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    char*                             strptr)
{
    exr_result_t rv =
        scratch->sequential_read (scratch, (void*) strptr, (uint64_t) attrsz);

    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    strptr[attrsz] = '\0';

    return exr_attr_string_init_static_with_length (
        (exr_context_t) ctxt, attrdata, strptr, attrsz);
}